

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O2

void __thiscall ALCdevice::ProcessUhj(ALCdevice *this,size_t SamplesToDo)

{
  pointer paVar1;
  
  paVar1 = (this->RealOut).Buffer.mData;
  Uhj2Encoder::encode((this->Uhj_Encoder)._M_t.
                      super___uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>._M_t.
                      super__Tuple_impl<0UL,_Uhj2Encoder_*,_std::default_delete<Uhj2Encoder>_>.
                      super__Head_base<0UL,_Uhj2Encoder_*,_false>._M_head_impl,
                      paVar1 + (this->RealOut).ChannelIndex._M_elems[0],
                      paVar1 + (this->RealOut).ChannelIndex._M_elems[1],(this->Dry).Buffer.mData,
                      SamplesToDo);
  return;
}

Assistant:

void ALCdevice::ProcessUhj(const size_t SamplesToDo)
{
    /* UHJ is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    /* Encode to stereo-compatible 2-channel UHJ output. */
    Uhj_Encoder->encode(RealOut.Buffer[lidx], RealOut.Buffer[ridx], Dry.Buffer.data(),
        SamplesToDo);
}